

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O0

size_t __thiscall
gmlc::containers::
BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
::size(BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
       *this)

{
  size_type sVar1;
  size_type sVar2;
  long in_RDI;
  lock_guard<std::mutex> pushLock;
  lock_guard<std::mutex> pullLock;
  mutex_type *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sVar1 = CLI::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(in_RDI + 0x68));
  sVar2 = CLI::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(in_RDI + 0x50));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4d193d);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4d1947);
  return sVar1 + sVar2;
}

Assistant:

size_t BlockingQueue<T, MUTEX, COND>::size() const
    {
        std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
        std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
        return pullElements.size() + pushElements.size();
    }